

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined4 local_98;
  undefined1 local_88 [8];
  string url3;
  string url2;
  string url1;
  string *prefix_local;
  string *full_type_name_local;
  ParserImpl *this_local;
  
  std::__cxx11::string::string((string *)(url2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(url3.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_88);
  bVar1 = ConsumeIdentifier(this,(string *)(url2.field_2._M_local_buf + 8));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,".",&local_b9);
    bVar1 = Consume(this,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    if (bVar1) {
      bVar1 = ConsumeIdentifier(this,(string *)((long)&url3.field_2 + 8));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,".",&local_e1);
        bVar1 = Consume(this,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        if (bVar1) {
          bVar1 = ConsumeIdentifier(this,(string *)local_88);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/",&local_109);
            bVar1 = Consume(this,&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator(&local_109);
            if (bVar1) {
              bVar1 = ConsumeFullTypeName(this,full_type_name);
              if (bVar1) {
                std::operator+(&local_1b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&url2.field_2 + 8),".");
                std::operator+(&local_190,&local_1b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&url3.field_2 + 8));
                std::operator+(&local_170,&local_190,".");
                std::operator+(&local_150,&local_170,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88);
                std::operator+(&local_130,&local_150,"/");
                std::__cxx11::string::operator=((string *)prefix,(string *)&local_130);
                std::__cxx11::string::~string((string *)&local_130);
                std::__cxx11::string::~string((string *)&local_150);
                std::__cxx11::string::~string((string *)&local_170);
                std::__cxx11::string::~string((string *)&local_190);
                std::__cxx11::string::~string((string *)&local_1b0);
                bVar1 = std::operator!=(prefix,"type.googleapis.com/");
                if ((bVar1) && (bVar1 = std::operator!=(prefix,"type.googleprod.com/"), bVar1)) {
                  std::operator+(&local_1f0,
                                 "TextFormat::Parser for Any supports only type.googleapis.com and type.googleprod.com, but found \""
                                 ,prefix);
                  std::operator+(&local_1d0,&local_1f0,"\"");
                  ReportError(this,&local_1d0);
                  std::__cxx11::string::~string((string *)&local_1d0);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = true;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  local_98 = 1;
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(url3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(url2.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool ConsumeAnyTypeUrl(string* full_type_name, string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    string url1, url2, url3;
    DO(ConsumeIdentifier(&url1));  // type
    DO(Consume("."));
    DO(ConsumeIdentifier(&url2));  // googleapis
    DO(Consume("."));
    DO(ConsumeIdentifier(&url3));  // com
    DO(Consume("/"));
    DO(ConsumeFullTypeName(full_type_name));

    *prefix = url1 + "." + url2 + "." + url3 + "/";
    if (*prefix != internal::kTypeGoogleApisComPrefix &&
        *prefix != internal::kTypeGoogleProdComPrefix) {
      ReportError("TextFormat::Parser for Any supports only "
                  "type.googleapis.com and type.googleprod.com, "
                  "but found \"" + *prefix + "\"");
      return false;
    }
    return true;
  }